

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod(MemoryLeakDetector *this)

{
  MemoryLeakDetectorNode *local_18;
  MemoryLeakDetectorNode *leak;
  MemoryLeakDetector *this_local;
  
  for (local_18 = MemoryLeakDetectorTable::getFirstLeak
                            (&this->memoryTable_,mem_leak_period_checking);
      local_18 != (MemoryLeakDetectorNode *)0x0;
      local_18 = MemoryLeakDetectorTable::getNextLeak
                           (&this->memoryTable_,local_18,mem_leak_period_checking)) {
    if (*(int *)(local_18 + 0x30) == 3) {
      *(undefined4 *)(local_18 + 0x30) = 2;
    }
  }
  return;
}

Assistant:

void MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod()
{
    MemoryLeakDetectorNode* leak = memoryTable_.getFirstLeak(mem_leak_period_checking);
    while (leak) {
        if (leak->period_ == mem_leak_period_checking) leak->period_ = mem_leak_period_enabled;
        leak = memoryTable_.getNextLeak(leak, mem_leak_period_checking);
    }
}